

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

HistoryEpochPtr __thiscall
libcellml::createHistoryEpoch
          (libcellml *this,UnitsConstPtr *units,string *sourceUrl,string *destinationUrl)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 auVar2 [16];
  HistoryEpochPtr HVar3;
  shared_ptr<const_libcellml::ImportedEntity> local_40;
  undefined1 local_29;
  string *local_28;
  string *destinationUrl_local;
  string *sourceUrl_local;
  UnitsConstPtr *units_local;
  shared_ptr<libcellml::HistoryEpoch> *h;
  
  local_29 = 0;
  local_28 = destinationUrl;
  destinationUrl_local = sourceUrl;
  sourceUrl_local = (string *)units;
  units_local = (UnitsConstPtr *)this;
  std::
  make_shared<libcellml::HistoryEpoch,std::shared_ptr<libcellml::Units_const>const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((shared_ptr<const_libcellml::Units> *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)units,sourceUrl);
  auVar2 = std::__cxx11::string::empty();
  _Var1._M_pi = auVar2._8_8_;
  if ((auVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::shared_ptr<libcellml::ImportedEntity_const>::shared_ptr<libcellml::Units_const,void>
              ((shared_ptr<libcellml::ImportedEntity_const> *)&local_40,
               (shared_ptr<const_libcellml::Units> *)sourceUrl_local);
    recordUrl((HistoryEpochPtr *)this,(ImportedEntityConstPtr *)&local_40);
    std::shared_ptr<const_libcellml::ImportedEntity>::~shared_ptr(&local_40);
    _Var1._M_pi = extraout_RDX;
  }
  HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (HistoryEpochPtr)
         HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

HistoryEpochPtr createHistoryEpoch(const UnitsConstPtr &units, const std::string &sourceUrl, const std::string &destinationUrl)
{
    auto h = std::make_shared<HistoryEpoch>(units, sourceUrl, destinationUrl);
    if (destinationUrl.empty()) {
        recordUrl(h, units);
    }
    return h;
}